

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::
Span<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>::
addStorage(Span<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
           *this)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Entry *pEVar10;
  uchar *puVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  size_t i;
  long lVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar41;
  undefined1 auVar39 [16];
  int iVar42;
  undefined1 auVar40 [16];
  int iVar43;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar67;
  undefined1 auVar66 [16];
  int iVar68;
  long lVar69;
  long lVar77;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  long lVar78;
  long lVar79;
  
  bVar1 = this->allocated;
  if (bVar1 == 0x30) {
    lVar15 = 0x50;
    uVar14 = 0xa00;
LAB_001f8df1:
    pEVar10 = (Entry *)operator_new__(uVar14);
    lVar12 = 0;
    uVar14 = 0;
    do {
      puVar11 = (this->entries->storage).data + lVar12;
      *(undefined8 *)((pEVar10->storage).data + lVar12) = *(undefined8 *)puVar11;
      QHttpNetworkRequest::QHttpNetworkRequest
                ((QHttpNetworkRequest *)((pEVar10->storage).data + lVar12 + 8),
                 (QHttpNetworkRequest *)(puVar11 + 8));
      *(undefined8 *)((pEVar10->storage).data + lVar12 + 0x18) = *(undefined8 *)(puVar11 + 0x18);
      QHttpNetworkRequest::~QHttpNetworkRequest
                ((QHttpNetworkRequest *)((this->entries->storage).data + lVar12 + 8));
      uVar14 = uVar14 + 1;
      uVar16 = (ulong)this->allocated;
      lVar12 = lVar12 + 0x20;
    } while (uVar14 < uVar16);
    if ((uint)lVar15 <= (uint)this->allocated) goto LAB_001f9506;
  }
  else {
    if (bVar1 != 0) {
      lVar15 = (ulong)bVar1 + 0x10;
      uVar14 = (ulong)(uint)((int)lVar15 << 5);
      goto LAB_001f8df1;
    }
    pEVar10 = (Entry *)operator_new__(0x600);
    lVar15 = 0x30;
    uVar16 = 0;
  }
  lVar12 = lVar15 - uVar16;
  lVar13 = lVar12 + -1;
  lVar69 = uVar16 + 0xe;
  lVar77 = uVar16 + 0xf;
  lVar27 = uVar16 + 0xc;
  lVar28 = uVar16 + 0xd;
  lVar29 = uVar16 + 10;
  lVar30 = uVar16 + 0xb;
  lVar31 = uVar16 + 8;
  lVar32 = uVar16 + 9;
  lVar33 = uVar16 + 6;
  lVar34 = uVar16 + 7;
  lVar35 = uVar16 + 4;
  lVar36 = uVar16 + 5;
  lVar78 = uVar16 + 2;
  lVar79 = uVar16 + 3;
  lVar17 = uVar16 + 1;
  auVar18._8_4_ = (int)lVar13;
  auVar18._0_8_ = lVar13;
  auVar18._12_4_ = (int)((ulong)lVar13 >> 0x20);
  puVar11 = pEVar10[0xf].storage.data + (uint)((int)uVar16 << 5);
  uVar14 = 0;
  do {
    auVar66._8_4_ = (int)uVar14;
    auVar66._0_8_ = uVar14;
    auVar66._12_4_ = (int)(uVar14 >> 0x20);
    auVar39 = auVar18 ^ _DAT_00258740;
    auVar37 = (auVar66 | _DAT_00258730) ^ _DAT_00258740;
    iVar67 = auVar39._0_4_;
    iVar43 = -(uint)(iVar67 < auVar37._0_4_);
    iVar68 = auVar39._4_4_;
    iVar54 = -(uint)(iVar68 < auVar37._4_4_);
    iVar41 = auVar39._8_4_;
    iVar55 = -(uint)(iVar41 < auVar37._8_4_);
    iVar42 = auVar39._12_4_;
    iVar56 = -(uint)(iVar42 < auVar37._12_4_);
    auVar70._4_4_ = iVar43;
    auVar70._0_4_ = iVar43;
    auVar70._8_4_ = iVar55;
    auVar70._12_4_ = iVar55;
    auVar62 = pshuflw(in_XMM12,auVar70,0xe8);
    auVar44._4_4_ = -(uint)(auVar37._4_4_ == iVar68);
    auVar44._12_4_ = -(uint)(auVar37._12_4_ == iVar42);
    auVar44._0_4_ = auVar44._4_4_;
    auVar44._8_4_ = auVar44._12_4_;
    auVar57 = pshuflw(in_XMM10,auVar44,0xe8);
    auVar38._4_4_ = iVar54;
    auVar38._0_4_ = iVar54;
    auVar38._8_4_ = iVar56;
    auVar38._12_4_ = iVar56;
    auVar39 = pshuflw(_DAT_00258740,auVar38,0xe8);
    auVar37._8_4_ = 0xffffffff;
    auVar37._0_8_ = 0xffffffffffffffff;
    auVar37._12_4_ = 0xffffffff;
    auVar37 = (auVar39 | auVar57 & auVar62) ^ auVar37;
    auVar37 = packssdw(auVar37,auVar37);
    if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar11[-0x1e0] = (char)uVar16 + '\x01';
    }
    auVar38 = auVar44 & auVar70 | auVar38;
    auVar37 = packssdw(auVar38,auVar38);
    auVar39._8_4_ = 0xffffffff;
    auVar39._0_8_ = 0xffffffffffffffff;
    auVar39._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 ^ auVar39,auVar37 ^ auVar39);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._0_4_ >> 8 & 1) != 0) {
      puVar11[-0x1c0] = (char)lVar17 + '\x01';
    }
    auVar37 = (auVar66 | _DAT_00258720) ^ _DAT_00258740;
    iVar43 = -(uint)(iVar67 < auVar37._0_4_);
    iVar55 = -(uint)(iVar68 < auVar37._4_4_);
    iVar54 = -(uint)(iVar41 < auVar37._8_4_);
    iVar56 = -(uint)(iVar42 < auVar37._12_4_);
    auVar62._4_4_ = iVar43;
    auVar62._0_4_ = iVar43;
    auVar62._8_4_ = iVar54;
    auVar62._12_4_ = iVar54;
    iVar43 = -(uint)(auVar37._4_4_ == iVar68);
    iVar54 = -(uint)(auVar37._12_4_ == iVar42);
    auVar71._4_4_ = iVar43;
    auVar71._0_4_ = iVar43;
    auVar71._8_4_ = iVar54;
    auVar71._12_4_ = iVar54;
    auVar63._4_4_ = iVar55;
    auVar63._0_4_ = iVar55;
    auVar63._8_4_ = iVar56;
    auVar63._12_4_ = iVar56;
    auVar37 = auVar71 & auVar62 | auVar63;
    auVar37 = packssdw(auVar37,auVar37);
    auVar57._8_4_ = 0xffffffff;
    auVar57._0_8_ = 0xffffffffffffffff;
    auVar57._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 ^ auVar57,auVar37 ^ auVar57);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._0_4_ >> 0x10 & 1) != 0) {
      puVar11[-0x1a0] = (char)lVar78 + '\x01';
    }
    auVar37 = pshufhw(auVar37,auVar62,0x84);
    auVar44 = pshufhw(auVar62,auVar71,0x84);
    auVar39 = pshufhw(auVar37,auVar63,0x84);
    auVar19._8_4_ = 0xffffffff;
    auVar19._0_8_ = 0xffffffffffffffff;
    auVar19._12_4_ = 0xffffffff;
    auVar19 = (auVar39 | auVar44 & auVar37) ^ auVar19;
    auVar37 = packssdw(auVar19,auVar19);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._0_4_ >> 0x18 & 1) != 0) {
      puVar11[-0x180] = (char)lVar79 + '\x01';
    }
    auVar37 = (auVar66 | _DAT_00258710) ^ _DAT_00258740;
    auVar58._0_4_ = -(uint)(iVar67 < auVar37._0_4_);
    auVar58._4_4_ = -(uint)(iVar68 < auVar37._4_4_);
    auVar58._8_4_ = -(uint)(iVar41 < auVar37._8_4_);
    auVar58._12_4_ = -(uint)(iVar42 < auVar37._12_4_);
    auVar72._4_4_ = auVar58._0_4_;
    auVar72._0_4_ = auVar58._0_4_;
    auVar72._8_4_ = auVar58._8_4_;
    auVar72._12_4_ = auVar58._8_4_;
    auVar44 = pshuflw(auVar63,auVar72,0xe8);
    auVar20._0_4_ = -(uint)(auVar37._0_4_ == iVar67);
    auVar20._4_4_ = -(uint)(auVar37._4_4_ == iVar68);
    auVar20._8_4_ = -(uint)(auVar37._8_4_ == iVar41);
    auVar20._12_4_ = -(uint)(auVar37._12_4_ == iVar42);
    auVar45._4_4_ = auVar20._4_4_;
    auVar45._0_4_ = auVar20._4_4_;
    auVar45._8_4_ = auVar20._12_4_;
    auVar45._12_4_ = auVar20._12_4_;
    auVar37 = pshuflw(auVar20,auVar45,0xe8);
    auVar46._4_4_ = auVar58._4_4_;
    auVar46._0_4_ = auVar58._4_4_;
    auVar46._8_4_ = auVar58._12_4_;
    auVar46._12_4_ = auVar58._12_4_;
    auVar39 = pshuflw(auVar58,auVar46,0xe8);
    auVar2._8_4_ = 0xffffffff;
    auVar2._0_8_ = 0xffffffffffffffff;
    auVar2._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 & auVar44,(auVar39 | auVar37 & auVar44) ^ auVar2);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      puVar11[-0x160] = (char)lVar35 + '\x01';
    }
    auVar46 = auVar45 & auVar72 | auVar46;
    auVar39 = packssdw(auVar46,auVar46);
    auVar3._8_4_ = 0xffffffff;
    auVar3._0_8_ = 0xffffffffffffffff;
    auVar3._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37,auVar39 ^ auVar3);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._4_2_ >> 8 & 1) != 0) {
      puVar11[-0x140] = (char)lVar36 + '\x01';
    }
    auVar37 = (auVar66 | _DAT_00258700) ^ _DAT_00258740;
    iVar43 = -(uint)(iVar67 < auVar37._0_4_);
    iVar55 = -(uint)(iVar68 < auVar37._4_4_);
    iVar54 = -(uint)(iVar41 < auVar37._8_4_);
    iVar56 = -(uint)(iVar42 < auVar37._12_4_);
    auVar47._4_4_ = iVar43;
    auVar47._0_4_ = iVar43;
    auVar47._8_4_ = iVar54;
    auVar47._12_4_ = iVar54;
    iVar43 = -(uint)(auVar37._4_4_ == iVar68);
    iVar54 = -(uint)(auVar37._12_4_ == iVar42);
    auVar64._4_4_ = iVar43;
    auVar64._0_4_ = iVar43;
    auVar64._8_4_ = iVar54;
    auVar64._12_4_ = iVar54;
    auVar73._4_4_ = iVar55;
    auVar73._0_4_ = iVar55;
    auVar73._8_4_ = iVar56;
    auVar73._12_4_ = iVar56;
    auVar37 = auVar64 & auVar47 | auVar73;
    auVar37 = packssdw(auVar37,auVar37);
    auVar4._8_4_ = 0xffffffff;
    auVar4._0_8_ = 0xffffffffffffffff;
    auVar4._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 ^ auVar4,auVar37 ^ auVar4);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      puVar11[-0x120] = (char)lVar33 + '\x01';
    }
    auVar37 = pshufhw(auVar37,auVar47,0x84);
    auVar44 = pshufhw(auVar47,auVar64,0x84);
    auVar39 = pshufhw(auVar37,auVar73,0x84);
    auVar21._8_4_ = 0xffffffff;
    auVar21._0_8_ = 0xffffffffffffffff;
    auVar21._12_4_ = 0xffffffff;
    auVar21 = (auVar39 | auVar44 & auVar37) ^ auVar21;
    auVar37 = packssdw(auVar21,auVar21);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._6_2_ >> 8 & 1) != 0) {
      puVar11[-0x100] = (char)lVar34 + '\x01';
    }
    auVar37 = (auVar66 | _DAT_002586f0) ^ _DAT_00258740;
    auVar59._0_4_ = -(uint)(iVar67 < auVar37._0_4_);
    auVar59._4_4_ = -(uint)(iVar68 < auVar37._4_4_);
    auVar59._8_4_ = -(uint)(iVar41 < auVar37._8_4_);
    auVar59._12_4_ = -(uint)(iVar42 < auVar37._12_4_);
    auVar74._4_4_ = auVar59._0_4_;
    auVar74._0_4_ = auVar59._0_4_;
    auVar74._8_4_ = auVar59._8_4_;
    auVar74._12_4_ = auVar59._8_4_;
    auVar44 = pshuflw(auVar64,auVar74,0xe8);
    auVar22._0_4_ = -(uint)(auVar37._0_4_ == iVar67);
    auVar22._4_4_ = -(uint)(auVar37._4_4_ == iVar68);
    auVar22._8_4_ = -(uint)(auVar37._8_4_ == iVar41);
    auVar22._12_4_ = -(uint)(auVar37._12_4_ == iVar42);
    auVar48._4_4_ = auVar22._4_4_;
    auVar48._0_4_ = auVar22._4_4_;
    auVar48._8_4_ = auVar22._12_4_;
    auVar48._12_4_ = auVar22._12_4_;
    auVar37 = pshuflw(auVar22,auVar48,0xe8);
    auVar49._4_4_ = auVar59._4_4_;
    auVar49._0_4_ = auVar59._4_4_;
    auVar49._8_4_ = auVar59._12_4_;
    auVar49._12_4_ = auVar59._12_4_;
    auVar39 = pshuflw(auVar59,auVar49,0xe8);
    auVar60._8_4_ = 0xffffffff;
    auVar60._0_8_ = 0xffffffffffffffff;
    auVar60._12_4_ = 0xffffffff;
    auVar60 = (auVar39 | auVar37 & auVar44) ^ auVar60;
    auVar39 = packssdw(auVar60,auVar60);
    auVar37 = packsswb(auVar37 & auVar44,auVar39);
    if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar11[-0xe0] = (char)lVar31 + '\x01';
    }
    auVar49 = auVar48 & auVar74 | auVar49;
    auVar39 = packssdw(auVar49,auVar49);
    auVar5._8_4_ = 0xffffffff;
    auVar5._0_8_ = 0xffffffffffffffff;
    auVar5._12_4_ = 0xffffffff;
    auVar39 = packssdw(auVar39 ^ auVar5,auVar39 ^ auVar5);
    auVar37 = packsswb(auVar37,auVar39);
    if ((auVar37._8_2_ >> 8 & 1) != 0) {
      puVar11[-0xc0] = (char)lVar32 + '\x01';
    }
    auVar37 = (auVar66 | _DAT_002586e0) ^ _DAT_00258740;
    iVar43 = -(uint)(iVar67 < auVar37._0_4_);
    iVar55 = -(uint)(iVar68 < auVar37._4_4_);
    iVar54 = -(uint)(iVar41 < auVar37._8_4_);
    iVar56 = -(uint)(iVar42 < auVar37._12_4_);
    auVar50._4_4_ = iVar43;
    auVar50._0_4_ = iVar43;
    auVar50._8_4_ = iVar54;
    auVar50._12_4_ = iVar54;
    iVar43 = -(uint)(auVar37._4_4_ == iVar68);
    iVar54 = -(uint)(auVar37._12_4_ == iVar42);
    auVar65._4_4_ = iVar43;
    auVar65._0_4_ = iVar43;
    auVar65._8_4_ = iVar54;
    auVar65._12_4_ = iVar54;
    auVar75._4_4_ = iVar55;
    auVar75._0_4_ = iVar55;
    auVar75._8_4_ = iVar56;
    auVar75._12_4_ = iVar56;
    auVar37 = auVar65 & auVar50 | auVar75;
    auVar37 = packssdw(auVar37,auVar37);
    auVar6._8_4_ = 0xffffffff;
    auVar6._0_8_ = 0xffffffffffffffff;
    auVar6._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 ^ auVar6,auVar37 ^ auVar6);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      puVar11[-0xa0] = (char)lVar29 + '\x01';
    }
    auVar37 = pshufhw(auVar37,auVar50,0x84);
    auVar44 = pshufhw(auVar50,auVar65,0x84);
    auVar39 = pshufhw(auVar37,auVar75,0x84);
    auVar23._8_4_ = 0xffffffff;
    auVar23._0_8_ = 0xffffffffffffffff;
    auVar23._12_4_ = 0xffffffff;
    auVar23 = (auVar39 | auVar44 & auVar37) ^ auVar23;
    auVar37 = packssdw(auVar23,auVar23);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._10_2_ >> 8 & 1) != 0) {
      puVar11[-0x80] = (char)lVar30 + '\x01';
    }
    auVar37 = (auVar66 | _DAT_002586d0) ^ _DAT_00258740;
    auVar61._0_4_ = -(uint)(iVar67 < auVar37._0_4_);
    auVar61._4_4_ = -(uint)(iVar68 < auVar37._4_4_);
    auVar61._8_4_ = -(uint)(iVar41 < auVar37._8_4_);
    auVar61._12_4_ = -(uint)(iVar42 < auVar37._12_4_);
    auVar76._4_4_ = auVar61._0_4_;
    auVar76._0_4_ = auVar61._0_4_;
    auVar76._8_4_ = auVar61._8_4_;
    auVar76._12_4_ = auVar61._8_4_;
    auVar44 = pshuflw(auVar65,auVar76,0xe8);
    auVar24._0_4_ = -(uint)(auVar37._0_4_ == iVar67);
    auVar24._4_4_ = -(uint)(auVar37._4_4_ == iVar68);
    auVar24._8_4_ = -(uint)(auVar37._8_4_ == iVar41);
    auVar24._12_4_ = -(uint)(auVar37._12_4_ == iVar42);
    auVar51._4_4_ = auVar24._4_4_;
    auVar51._0_4_ = auVar24._4_4_;
    auVar51._8_4_ = auVar24._12_4_;
    auVar51._12_4_ = auVar24._12_4_;
    auVar37 = pshuflw(auVar24,auVar51,0xe8);
    auVar52._4_4_ = auVar61._4_4_;
    auVar52._0_4_ = auVar61._4_4_;
    auVar52._8_4_ = auVar61._12_4_;
    auVar52._12_4_ = auVar61._12_4_;
    auVar39 = pshuflw(auVar61,auVar52,0xe8);
    auVar7._8_4_ = 0xffffffff;
    auVar7._0_8_ = 0xffffffffffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 & auVar44,(auVar39 | auVar37 & auVar44) ^ auVar7);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      puVar11[-0x60] = (char)lVar27 + '\x01';
    }
    auVar52 = auVar51 & auVar76 | auVar52;
    auVar39 = packssdw(auVar52,auVar52);
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37,auVar39 ^ auVar8);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._12_2_ >> 8 & 1) != 0) {
      puVar11[-0x40] = (char)lVar28 + '\x01';
    }
    auVar37 = (auVar66 | _DAT_002586c0) ^ _DAT_00258740;
    auVar25._0_4_ = -(uint)(iVar67 < auVar37._0_4_);
    auVar25._4_4_ = -(uint)(iVar68 < auVar37._4_4_);
    auVar25._8_4_ = -(uint)(iVar41 < auVar37._8_4_);
    auVar25._12_4_ = -(uint)(iVar42 < auVar37._12_4_);
    auVar53._4_4_ = auVar25._0_4_;
    auVar53._0_4_ = auVar25._0_4_;
    auVar53._8_4_ = auVar25._8_4_;
    auVar53._12_4_ = auVar25._8_4_;
    iVar67 = -(uint)(auVar37._4_4_ == iVar68);
    iVar68 = -(uint)(auVar37._12_4_ == iVar42);
    auVar40._4_4_ = iVar67;
    auVar40._0_4_ = iVar67;
    auVar40._8_4_ = iVar68;
    auVar40._12_4_ = iVar68;
    in_XMM12._4_4_ = auVar25._4_4_;
    in_XMM12._0_4_ = auVar25._4_4_;
    in_XMM12._8_4_ = auVar25._12_4_;
    in_XMM12._12_4_ = auVar25._12_4_;
    in_XMM10 = auVar40 & auVar53 | in_XMM12;
    auVar37 = packssdw(auVar25,in_XMM10);
    auVar9._8_4_ = 0xffffffff;
    auVar9._0_8_ = 0xffffffffffffffff;
    auVar9._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 ^ auVar9,auVar37 ^ auVar9);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      puVar11[-0x20] = (char)lVar69 + '\x01';
    }
    auVar37 = pshufhw(auVar37,auVar53,0x84);
    auVar44 = pshufhw(auVar40,auVar40,0x84);
    auVar39 = pshufhw(auVar37,in_XMM12,0x84);
    auVar26._8_4_ = 0xffffffff;
    auVar26._0_8_ = 0xffffffffffffffff;
    auVar26._12_4_ = 0xffffffff;
    auVar26 = (auVar39 | auVar44 & auVar37) ^ auVar26;
    auVar37 = packssdw(auVar26,auVar26);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._14_2_ >> 8 & 1) != 0) {
      *puVar11 = (char)lVar77 + '\x01';
    }
    uVar14 = uVar14 + 0x10;
    uVar16 = uVar16 + 0x10;
    lVar17 = lVar17 + 0x10;
    lVar78 = lVar78 + 0x10;
    lVar79 = lVar79 + 0x10;
    lVar35 = lVar35 + 0x10;
    lVar36 = lVar36 + 0x10;
    lVar33 = lVar33 + 0x10;
    lVar34 = lVar34 + 0x10;
    lVar31 = lVar31 + 0x10;
    lVar32 = lVar32 + 0x10;
    lVar29 = lVar29 + 0x10;
    lVar30 = lVar30 + 0x10;
    lVar27 = lVar27 + 0x10;
    lVar28 = lVar28 + 0x10;
    lVar69 = lVar69 + 0x10;
    lVar77 = lVar77 + 0x10;
    puVar11 = puVar11 + 0x200;
  } while ((lVar12 + 0xfU & 0xfffffffffffffff0) != uVar14);
LAB_001f9506:
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = pEVar10;
  this->allocated = (uchar)lVar15;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }